

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# der.c
# Opt level: O2

size_t derOIDEnc(octet *der,char *oid)

{
  int iVar1;
  bool_t bVar2;
  long lVar3;
  size_t sVar4;
  uint uVar5;
  int iVar6;
  octet *poVar7;
  char cVar8;
  long lVar9;
  int iVar10;
  uint uVar11;
  char *pcVar12;
  char *pcVar13;
  
  bVar2 = oidIsValid(oid);
  if (bVar2 != 0) {
    iVar6 = *oid + -0x30;
    pcVar12 = oid + 2;
    sVar4 = 0;
    do {
      iVar10 = 0;
      pcVar13 = pcVar12;
      while( true ) {
        pcVar12 = pcVar13 + 1;
        cVar8 = *pcVar13;
        if ((cVar8 == '.') || (cVar8 == '\0')) break;
        iVar10 = iVar10 * 10 + (int)cVar8 + -0x30;
        pcVar13 = pcVar12;
      }
      iVar1 = iVar6 * 0x28;
      if (iVar6 == 3) {
        iVar1 = 0;
      }
      poVar7 = der + sVar4;
      if (der == (octet *)0x0) {
        poVar7 = (octet *)0x0;
      }
      uVar5 = iVar1 + iVar10;
      lVar3 = 1;
      if (uVar5 != 0) {
        lVar3 = 0;
        for (uVar11 = uVar5; uVar11 != 0; uVar11 = uVar11 >> 7) {
          lVar3 = lVar3 + 1;
        }
      }
      if (poVar7 != (octet *)0x0) {
        uVar11 = uVar5 & 0xffffff7f;
        lVar9 = lVar3;
        while( true ) {
          lVar9 = lVar9 + -1;
          poVar7[lVar9] = (octet)uVar11;
          if (lVar9 == 0) break;
          uVar5 = uVar5 >> 7;
          uVar11 = uVar5 | 0x80;
        }
        cVar8 = *pcVar13;
      }
      sVar4 = lVar3 + sVar4;
      iVar6 = 3;
    } while (cVar8 != '\0');
    sVar4 = derEnc(der,6,der,sVar4);
    return sVar4;
  }
  return 0xffffffffffffffff;
}

Assistant:

size_t derOIDEnc(octet der[], const char* oid)
{
	u32 d1;
	u32 val = 0;
	size_t pos = 0;
	size_t count = 0;
	// корректен?
	if (!oidIsValid(oid))
		return SIZE_MAX;
	// pre
	ASSERT(oid[0] == '0' || oid[0] == '1' || oid[0] == '2');
	ASSERT(oid[1] == '.');
	// обработать d1
	d1 = oid[0] - '0';
	oid += 2;
	// цикл по символам oid
	while (1)
	{
		// закончили очередное число?
		if (oid[pos] == '.' || oid[pos] == '\0')
		{
			// закончили d2?
			if (d1 != 3)
				val += 40 * d1, d1 = 3;
			// обработать число
			count += derSIDEnc(der ? der + count : der, val);
			// конец строки?
			if (oid[pos] == '\0')
				break;
			// к следующему числу
			oid += ++pos, pos = 0, val = 0;
				continue;
		}
		// обработать цифру
		val *= 10;
		val += oid[pos] - '0';
		++pos;
	}
	// кодировать TL
	count = derEnc(der, 0x06, der, count);
	// очистка и выход
	d1 = val = 0, pos = 0;
	return count;
}